

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O2

void __thiscall TinyGC::Mark(TinyGC *this)

{
  _Hash_node_base *p_Var1;
  ostream *poVar2;
  iterator iVar3;
  __node_base *p_Var4;
  _Hash_node_base *p_Var5;
  undefined1 local_48 [8];
  unique_lock<std::mutex> lck;
  GarbageCollectedBase *ptr;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_48,&this->ts_mxt_);
  poVar2 = std::operator<<((ostream *)&std::cerr,"\nMark Start~");
  std::endl<char,std::char_traits<char>>(poVar2);
  SetGCPhase(this,kMarking);
  this->visitor_->mark_ = true;
  p_Var4 = &(this->thread_to_stack_)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
    p_Var1[1]._M_nxt = (_Hash_node_base *)&stack0xfffffffffffffff8;
    p_Var1 = p_Var1->_M_nxt;
    for (p_Var5 = (_Hash_node_base *)&stack0xfffffffffffffff8; p_Var5 < p_Var1; p_Var5 = p_Var5 + 1)
    {
      if (&Elf64_Ehdr_00100000 < (Elf64_Ehdr *)p_Var5->_M_nxt) {
        lck._8_8_ = (Elf64_Ehdr *)p_Var5->_M_nxt;
        iVar3 = std::
                _Hashtable<GarbageCollectedBase_*,_GarbageCollectedBase_*,_std::allocator<GarbageCollectedBase_*>,_std::__detail::_Identity,_std::equal_to<GarbageCollectedBase_*>,_std::hash<GarbageCollectedBase_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find((_Hashtable<GarbageCollectedBase_*,_GarbageCollectedBase_*,_std::allocator<GarbageCollectedBase_*>,_std::__detail::_Identity,_std::equal_to<GarbageCollectedBase_*>,_std::hash<GarbageCollectedBase_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)this,(key_type *)&lck._M_owns);
        if (iVar3.super__Node_iterator_base<GarbageCollectedBase_*,_false>._M_cur !=
            (__node_type *)0x0) {
          Visitor::ObjTrace(this->visitor_,(GarbageCollectedBase *)lck._8_8_);
          poVar2 = std::operator<<((ostream *)&std::cerr,"find object at ");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  return;
}

Assistant:

void TinyGC::Mark() {
  std::unique_lock<std::mutex> lck(ts_mxt_);
  LOG("\nMark Start~");
  SetGCPhase(GCPhase::kMarking);
  visitor_->SetMark(true);

  for (auto &ts_ : thread_to_stack_) {
    ThreadState *ts = ts_.second;
    ts->GetCurrentStackPosition();
    intptr_t **start = reinterpret_cast<intptr_t **>(ts->GetStackEndAddr());
    intptr_t **end = reinterpret_cast<intptr_t **>(ts->GetStackStartAddr());
    for (; start < end; start++) {
      if (*start > (intptr_t *)0x100000) {
        GarbageCollectedBase *ptr =
            reinterpret_cast<GarbageCollectedBase *>(*start);
        if (objs_addr_.find(ptr) != objs_addr_.end()) {
          visitor_->ObjTrace((GarbageCollectedBase *)ptr);
          LOG("find object at " << std::hex << ptr);
        }
      }
    }
  }
}